

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O2

int unescapestring(char *dst,char *src,char *end)

{
  long lVar1;
  char cVar2;
  char *pcVar3;
  
  lVar1 = 0;
  while (src < end) {
    pcVar3 = src + 1;
    cVar2 = *src;
    if (cVar2 == '^') {
      if (end <= pcVar3) break;
      cVar2 = src[1];
      pcVar3 = src + 2;
      if (cVar2 == 'f') {
        cVar2 = '\f';
      }
      else if (cVar2 == 'n') {
        cVar2 = '\n';
      }
      else if (cVar2 == 't') {
        cVar2 = '\t';
      }
    }
    dst[lVar1] = cVar2;
    lVar1 = lVar1 + 1;
    src = pcVar3;
  }
  return (int)lVar1;
}

Assistant:

int unescapestring(char *dst, const char *src, const char *end)
{
    char *start = dst;
    while(src < end)
    {
        int c = *src++;
        if(c == '^')
        {
            if(src >= end) break;
            int e = *src++;
            switch(e)
            {
                case 'n': *dst++ = '\n'; break;
                case 't': *dst++ = '\t'; break;
                case 'f': *dst++ = '\f'; break;
                default: *dst++ = e; break;
            }
        }
        else *dst++ = c;
    }
    return dst - start;
}